

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

string * __thiscall
pbrt::BDPTIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,BDPTIntegrator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<int_const&,bool_const&,bool_const&,bool_const&,pbrt::LightSamplerHandle_const&>
            (__return_storage_ptr__,
             "[ BDPTIntegrator maxDepth: %d visualizeStrategies: %s visualizeWeights: %s regularize: %s lightSampler: %s ]"
             ,&this->maxDepth,&this->visualizeStrategies,&this->visualizeWeights,&this->regularize,
             &this->lightSampler);
  return __return_storage_ptr__;
}

Assistant:

std::string BDPTIntegrator::ToString() const {
    return StringPrintf("[ BDPTIntegrator maxDepth: %d visualizeStrategies: %s "
                        "visualizeWeights: %s regularize: %s lightSampler: %s ]",
                        maxDepth, visualizeStrategies, visualizeWeights, regularize,
                        lightSampler);
}